

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fMultisampleTests.cpp
# Opt level: O0

int __thiscall
deqp::gles31::Functional::anon_unknown_0::SamplePosQueryCase::init
          (SamplePosQueryCase *this,EVP_PKEY_CTX *ctx)

{
  int iVar1;
  RenderTarget *this_00;
  NotSupportedError *this_01;
  allocator<char> local_31;
  string local_30;
  SamplePosQueryCase *local_10;
  SamplePosQueryCase *this_local;
  
  local_10 = this;
  this_00 = gles31::Context::getRenderTarget((this->super_TestCase).m_context);
  iVar1 = tcu::RenderTarget::getNumSamples(this_00);
  if (iVar1 == 0) {
    this_01 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_30,"No multisample buffers",&local_31);
    tcu::NotSupportedError::NotSupportedError(this_01,&local_30);
    __cxa_throw(this_01,&tcu::NotSupportedError::typeinfo,tcu::NotSupportedError::~NotSupportedError
               );
  }
  return iVar1;
}

Assistant:

void SamplePosQueryCase::init (void)
{
	if (m_context.getRenderTarget().getNumSamples() == 0)
		throw tcu::NotSupportedError("No multisample buffers");
}